

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

char * max_expand(MatchState *ms,char *s,char *p,char *ep)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar3 = (long)ms->src_end - (long)s;
  if (ms->src_end < s || lVar3 == 0) {
    lVar5 = 0;
  }
  else {
    lVar4 = 0;
    do {
      iVar1 = singlematch((uint)(byte)s[lVar4],p,ep);
      lVar5 = lVar4;
      if (iVar1 == 0) break;
      lVar4 = lVar4 + 1;
      lVar5 = lVar3;
    } while (lVar3 != lVar4);
  }
  do {
    if (lVar5 < 0) {
      return (char *)0x0;
    }
    pcVar2 = match(ms,s + lVar5,ep + 1);
    lVar5 = lVar5 + -1;
  } while (pcVar2 == (char *)0x0);
  return pcVar2;
}

Assistant:

static const char *max_expand(MatchState *ms, const char *s,
			      const char *p, const char *ep)
{
  ptrdiff_t i = 0;  /* counts maximum expand for item */
  while ((s+i)<ms->src_end && singlematch(uchar(*(s+i)), p, ep))
    i++;
  /* keeps trying to match with the maximum repetitions */
  while (i>=0) {
    const char *res = match(ms, (s+i), ep+1);
    if (res) return res;
    i--;  /* else didn't match; reduce 1 repetition to try again */
  }
  return NULL;
}